

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int little2_scanDecl(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  if ((long)end - (long)ptr < 2) {
    return -1;
  }
  if (ptr[1] == '\0') {
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
    case 0x14:
      *nextTokPtr = ptr + 2;
      return 0x21;
    case 0x16:
    case 0x18:
      ptr = ptr + 2;
      uVar4 = (long)end - (long)ptr;
      if ((long)uVar4 < 2) {
        return -1;
      }
LAB_006314b1:
      if (((byte *)ptr)[1] == 0) {
        bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
        switch(bVar1) {
        case 0x15:
          break;
        case 0x16:
        case 0x18:
          goto switchD_006314d5_caseD_16;
        case 0x17:
        case 0x19:
        case 0x1a:
        case 0x1b:
        case 0x1c:
        case 0x1d:
          goto switchD_00631496_caseD_15;
        case 0x1e:
          if (uVar4 < 4) {
            return -1;
          }
          if (((((byte *)ptr)[3] == 0) &&
              (uVar3 = (uint)*(byte *)((long)enc[1].scanners + (ulong)((byte *)ptr)[2]),
              uVar3 < 0x1f)) && ((0x40200600U >> (uVar3 & 0x1f) & 1) != 0))
          goto switchD_00631496_caseD_15;
          break;
        default:
          if (1 < bVar1 - 9) goto switchD_00631496_caseD_15;
        }
        *nextTokPtr = ptr;
        return 0x10;
      }
      break;
    case 0x1b:
      iVar2 = little2_scanComment(enc,ptr + 2,end,nextTokPtr);
      return iVar2;
    }
  }
switchD_00631496_caseD_15:
  *nextTokPtr = ptr;
  return 0;
switchD_006314d5_caseD_16:
  ptr = (char *)((byte *)ptr + 2);
  uVar4 = uVar4 - 2;
  if ((long)uVar4 < 2) {
    return -1;
  }
  goto LAB_006314b1;
}

Assistant:

static int PTRCALL
PREFIX(scanDecl)(const ENCODING *enc, const char *ptr, const char *end,
                 const char **nextTokPtr) {
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_MINUS:
    return PREFIX(scanComment)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_LSQB:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_COND_SECT_OPEN;
  case BT_NMSTRT:
  case BT_HEX:
    ptr += MINBPC(enc);
    break;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_PERCNT:
      REQUIRE_CHARS(enc, ptr, end, 2);
      /* don't allow <!ENTITY% foo "whatever"> */
      switch (BYTE_TYPE(enc, ptr + MINBPC(enc))) {
      case BT_S:
      case BT_CR:
      case BT_LF:
      case BT_PERCNT:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      /* fall through */
    case BT_S:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DECL_OPEN;
    case BT_NMSTRT:
    case BT_HEX:
      ptr += MINBPC(enc);
      break;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}